

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

int nn_ws_validate_value(char *expected,char *subj,size_t subj_len,int case_insensitive)

{
  char cVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  int iVar4;
  char cVar5;
  long lVar6;
  
  sVar2 = strlen(expected);
  if (sVar2 == subj_len) {
    cVar5 = *expected;
    iVar4 = 1;
    if (cVar5 != '\0') {
      lVar6 = 0;
      do {
        cVar1 = subj[lVar6];
        if ((long)cVar1 == 0) {
          return 1;
        }
        pp_Var3 = __ctype_tolower_loc();
        if ((*pp_Var3)[cVar5] != (*pp_Var3)[cVar1]) goto LAB_0015f0a1;
        cVar5 = expected[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (cVar5 != '\0');
    }
  }
  else {
LAB_0015f0a1:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int nn_ws_validate_value (const char* expected, const char *subj,
    size_t subj_len, int case_insensitive)
{
    if (strlen (expected) != subj_len)
        return NN_WS_HANDSHAKE_NOMATCH;

    if (case_insensitive) {
        while (*expected && *subj) {
            if (tolower (*expected) != tolower (*subj))
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }
    else {
        while (*expected && *subj) {
            if (*expected != *subj)
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }

    return NN_WS_HANDSHAKE_MATCH;
}